

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  undefined1 auVar60 [32];
  undefined4 uVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 (*pauVar75) [16];
  int iVar76;
  uint uVar77;
  long lVar78;
  ulong uVar79;
  long lVar80;
  uint uVar81;
  Scene *pSVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  undefined1 auVar86 [8];
  ulong uVar87;
  undefined1 (*pauVar88) [16];
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  long lVar92;
  ulong unaff_R15;
  size_t mask;
  float fVar93;
  float fVar106;
  float fVar107;
  vint4 bi_1;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar94 [16];
  float fVar108;
  undefined1 auVar99 [32];
  undefined1 auVar95 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vint4 bi;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vint4 ai;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [32];
  undefined1 auVar125 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar134;
  undefined1 auVar133 [64];
  float fVar135;
  float fVar141;
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  float fVar145;
  float fVar147;
  float fVar148;
  uint uVar149;
  float fVar150;
  uint uVar151;
  float fVar152;
  uint uVar153;
  float fVar154;
  uint uVar155;
  float fVar156;
  uint uVar157;
  uint uVar158;
  undefined1 auVar146 [64];
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [32];
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar168 [32];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  Scene *scene;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  RTCFilterFunctionNArguments local_1470;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  Scene *local_1400;
  undefined1 auStack_13f8 [24];
  undefined1 local_13e0 [8];
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  undefined4 uStack_13c4;
  undefined1 local_13c0 [32];
  undefined1 local_1390 [16];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float local_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar88 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1330._4_4_ = uVar1;
  local_1330._0_4_ = uVar1;
  local_1330._8_4_ = uVar1;
  local_1330._12_4_ = uVar1;
  auVar133 = ZEXT1664(local_1330);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1340._4_4_ = uVar1;
  local_1340._0_4_ = uVar1;
  local_1340._8_4_ = uVar1;
  local_1340._12_4_ = uVar1;
  auVar138 = ZEXT1664(local_1340);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1350._4_4_ = uVar1;
  local_1350._0_4_ = uVar1;
  local_1350._8_4_ = uVar1;
  local_1350._12_4_ = uVar1;
  auVar146 = ZEXT1664(local_1350);
  local_1360 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1370 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1380 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar87 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar83 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar84 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar91 = uVar87 ^ 0x10;
  iVar76 = (tray->tfar).field_0.i[k];
  auVar105 = ZEXT1664(CONCAT412(iVar76,CONCAT48(iVar76,CONCAT44(iVar76,iVar76))));
  iVar76 = (tray->tnear).field_0.i[k];
  local_1390._4_4_ = iVar76;
  local_1390._0_4_ = iVar76;
  local_1390._8_4_ = iVar76;
  local_1390._12_4_ = iVar76;
  auVar180 = ZEXT1664(local_1390);
  uVar81 = 1 << ((byte)k & 0x1f);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  uVar79 = (ulong)((uVar81 & 0xf) << 4);
  lVar80 = (long)((int)uVar81 >> 4) * 0x10;
  auVar126._8_4_ = 0x3f800000;
  auVar126._0_8_ = &DAT_3f8000003f800000;
  auVar126._12_4_ = 0x3f800000;
  auVar126._16_4_ = 0x3f800000;
  auVar126._20_4_ = 0x3f800000;
  auVar126._24_4_ = 0x3f800000;
  auVar126._28_4_ = 0x3f800000;
  auVar103._8_4_ = 0xbf800000;
  auVar103._0_8_ = 0xbf800000bf800000;
  auVar103._12_4_ = 0xbf800000;
  auVar103._16_4_ = 0xbf800000;
  auVar103._20_4_ = 0xbf800000;
  auVar103._24_4_ = 0xbf800000;
  auVar103._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar126,auVar103,local_1100);
  fVar93 = local_1360;
  fVar106 = local_1360;
  fVar107 = local_1360;
  fVar108 = local_1360;
  fVar109 = local_1370;
  fVar110 = local_1370;
  fVar111 = local_1370;
  fVar134 = local_1370;
  fVar175 = local_1380;
  fVar176 = local_1380;
  fVar177 = local_1380;
  fVar178 = local_1380;
  fStack_137c = local_1380;
  fStack_1378 = local_1380;
  fStack_1374 = local_1380;
  fStack_136c = local_1370;
  fStack_1368 = local_1370;
  fStack_1364 = local_1370;
  fStack_135c = local_1360;
  fStack_1358 = local_1360;
  fStack_1354 = local_1360;
  do {
    do {
      do {
        if (pauVar88 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar75 = pauVar88 + -1;
        pauVar88 = pauVar88 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar75 + 8));
      uVar90 = *(ulong *)*pauVar88;
      do {
        if ((uVar90 & 8) == 0) {
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar90 + 0x20 + uVar87),auVar133._0_16_);
          auVar112._0_4_ = fVar93 * auVar95._0_4_;
          auVar112._4_4_ = fVar106 * auVar95._4_4_;
          auVar112._8_4_ = fVar107 * auVar95._8_4_;
          auVar112._12_4_ = fVar108 * auVar95._12_4_;
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar90 + 0x20 + uVar83),auVar138._0_16_);
          auVar94._0_4_ = fVar109 * auVar95._0_4_;
          auVar94._4_4_ = fVar110 * auVar95._4_4_;
          auVar94._8_4_ = fVar111 * auVar95._8_4_;
          auVar94._12_4_ = fVar134 * auVar95._12_4_;
          auVar95 = vpmaxsd_avx(auVar112,auVar94);
          auVar112 = vsubps_avx(*(undefined1 (*) [16])(uVar90 + 0x20 + uVar84),auVar146._0_16_);
          auVar136._0_4_ = fVar175 * auVar112._0_4_;
          auVar136._4_4_ = fVar176 * auVar112._4_4_;
          auVar136._8_4_ = fVar177 * auVar112._8_4_;
          auVar136._12_4_ = fVar178 * auVar112._12_4_;
          auVar112 = vpmaxsd_avx(auVar136,auVar180._0_16_);
          auVar112 = vpmaxsd_avx(auVar95,auVar112);
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar90 + 0x20 + uVar91),auVar133._0_16_);
          auVar118._0_4_ = fVar93 * auVar95._0_4_;
          auVar118._4_4_ = fVar106 * auVar95._4_4_;
          auVar118._8_4_ = fVar107 * auVar95._8_4_;
          auVar118._12_4_ = fVar108 * auVar95._12_4_;
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar90 + 0x20 + (uVar83 ^ 0x10)),
                               auVar138._0_16_);
          auVar123._0_4_ = fVar109 * auVar95._0_4_;
          auVar123._4_4_ = fVar110 * auVar95._4_4_;
          auVar123._8_4_ = fVar111 * auVar95._8_4_;
          auVar123._12_4_ = fVar134 * auVar95._12_4_;
          auVar95 = vpminsd_avx(auVar118,auVar123);
          auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar90 + 0x20 + (uVar84 ^ 0x10)),
                               auVar146._0_16_);
          auVar124._0_4_ = fVar175 * auVar94._0_4_;
          auVar124._4_4_ = fVar176 * auVar94._4_4_;
          auVar124._8_4_ = fVar177 * auVar94._8_4_;
          auVar124._12_4_ = fVar178 * auVar94._12_4_;
          auVar94 = vpminsd_avx(auVar124,auVar105._0_16_);
          auVar95 = vpminsd_avx(auVar95,auVar94);
          auVar95 = vpcmpgtd_avx(auVar112,auVar95);
          uVar81 = vmovmskps_avx(auVar95);
          unaff_R15 = ((ulong)uVar81 ^ 0xf) & 0xff;
          local_1300._0_16_ = auVar112;
        }
        if ((uVar90 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar76 = 4;
          }
          else {
            uVar89 = uVar90 & 0xfffffffffffffff0;
            lVar92 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
              }
            }
            iVar76 = 0;
            uVar90 = *(ulong *)(uVar89 + lVar92 * 8);
            uVar85 = unaff_R15 - 1 & unaff_R15;
            if (uVar85 != 0) {
              uVar81 = *(uint *)(local_1300 + lVar92 * 4);
              lVar92 = 0;
              if (uVar85 != 0) {
                for (; (uVar85 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
                }
              }
              uVar4 = *(ulong *)(uVar89 + lVar92 * 8);
              uVar77 = *(uint *)(local_1300 + lVar92 * 4);
              uVar85 = uVar85 - 1 & uVar85;
              if (uVar85 == 0) {
                if (uVar81 < uVar77) {
                  *(ulong *)*pauVar88 = uVar4;
                  *(uint *)(*pauVar88 + 8) = uVar77;
                  pauVar88 = pauVar88 + 1;
                }
                else {
                  *(ulong *)*pauVar88 = uVar90;
                  *(uint *)(*pauVar88 + 8) = uVar81;
                  pauVar88 = pauVar88 + 1;
                  uVar90 = uVar4;
                }
              }
              else {
                auVar95._8_8_ = 0;
                auVar95._0_8_ = uVar90;
                auVar95 = vpunpcklqdq_avx(auVar95,ZEXT416(uVar81));
                auVar119._8_8_ = 0;
                auVar119._0_8_ = uVar4;
                auVar112 = vpunpcklqdq_avx(auVar119,ZEXT416(uVar77));
                lVar92 = 0;
                if (uVar85 != 0) {
                  for (; (uVar85 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
                  }
                }
                auVar125._8_8_ = 0;
                auVar125._0_8_ = *(ulong *)(uVar89 + lVar92 * 8);
                auVar136 = vpunpcklqdq_avx(auVar125,ZEXT416(*(uint *)(local_1300 + lVar92 * 4)));
                auVar94 = vpcmpgtd_avx(auVar112,auVar95);
                uVar85 = uVar85 - 1 & uVar85;
                if (uVar85 == 0) {
                  auVar118 = vpshufd_avx(auVar94,0xaa);
                  auVar94 = vblendvps_avx(auVar112,auVar95,auVar118);
                  auVar95 = vblendvps_avx(auVar95,auVar112,auVar118);
                  auVar112 = vpcmpgtd_avx(auVar136,auVar94);
                  auVar118 = vpshufd_avx(auVar112,0xaa);
                  auVar112 = vblendvps_avx(auVar136,auVar94,auVar118);
                  auVar94 = vblendvps_avx(auVar94,auVar136,auVar118);
                  auVar136 = vpcmpgtd_avx(auVar94,auVar95);
                  auVar118 = vpshufd_avx(auVar136,0xaa);
                  auVar136 = vblendvps_avx(auVar94,auVar95,auVar118);
                  auVar95 = vblendvps_avx(auVar95,auVar94,auVar118);
                  *pauVar88 = auVar95;
                  pauVar88[1] = auVar136;
                  uVar90 = auVar112._0_8_;
                  pauVar88 = pauVar88 + 2;
                }
                else {
                  lVar92 = 0;
                  if (uVar85 != 0) {
                    for (; (uVar85 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
                    }
                  }
                  auVar128._8_8_ = 0;
                  auVar128._0_8_ = *(ulong *)(uVar89 + lVar92 * 8);
                  auVar123 = vpunpcklqdq_avx(auVar128,ZEXT416(*(uint *)(local_1300 + lVar92 * 4)));
                  auVar118 = vpshufd_avx(auVar94,0xaa);
                  auVar94 = vblendvps_avx(auVar112,auVar95,auVar118);
                  auVar95 = vblendvps_avx(auVar95,auVar112,auVar118);
                  auVar112 = vpcmpgtd_avx(auVar123,auVar136);
                  auVar118 = vpshufd_avx(auVar112,0xaa);
                  auVar112 = vblendvps_avx(auVar123,auVar136,auVar118);
                  auVar136 = vblendvps_avx(auVar136,auVar123,auVar118);
                  auVar118 = vpcmpgtd_avx(auVar136,auVar95);
                  auVar123 = vpshufd_avx(auVar118,0xaa);
                  auVar118 = vblendvps_avx(auVar136,auVar95,auVar123);
                  auVar95 = vblendvps_avx(auVar95,auVar136,auVar123);
                  auVar136 = vpcmpgtd_avx(auVar112,auVar94);
                  auVar123 = vpshufd_avx(auVar136,0xaa);
                  auVar136 = vblendvps_avx(auVar112,auVar94,auVar123);
                  auVar112 = vblendvps_avx(auVar94,auVar112,auVar123);
                  auVar94 = vpcmpgtd_avx(auVar118,auVar112);
                  auVar123 = vpshufd_avx(auVar94,0xaa);
                  auVar94 = vblendvps_avx(auVar118,auVar112,auVar123);
                  auVar112 = vblendvps_avx(auVar112,auVar118,auVar123);
                  *pauVar88 = auVar95;
                  pauVar88[1] = auVar112;
                  pauVar88[2] = auVar94;
                  uVar90 = auVar136._0_8_;
                  pauVar88 = pauVar88 + 3;
                }
              }
            }
          }
        }
        else {
          iVar76 = 6;
        }
      } while (iVar76 == 0);
    } while (iVar76 != 6);
    auVar86 = (undefined1  [8])((ulong)((uint)uVar90 & 0xf) - 8);
    if (auVar86 != (undefined1  [8])0x0) {
      uVar90 = uVar90 & 0xfffffffffffffff0;
      lVar92 = 0;
      do {
        lVar78 = lVar92 * 0x60;
        pSVar82 = context->scene;
        ppfVar5 = (pSVar82->vertices).items;
        pfVar6 = ppfVar5[*(uint *)(uVar90 + 0x40 + lVar78)];
        pfVar7 = ppfVar5[*(uint *)(uVar90 + 0x44 + lVar78)];
        pfVar8 = ppfVar5[*(uint *)(uVar90 + 0x48 + lVar78)];
        pfVar9 = ppfVar5[*(uint *)(uVar90 + 0x4c + lVar78)];
        auVar94 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + lVar78)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 8 + lVar78)));
        auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + lVar78)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 8 + lVar78)));
        auVar136 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 4 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0xc + lVar78)));
        auVar112 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 4 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0xc + lVar78)));
        auVar123 = vunpcklps_avx(auVar95,auVar112);
        auVar124 = vunpcklps_avx(auVar94,auVar136);
        auVar112 = vunpckhps_avx(auVar94,auVar136);
        auVar136 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + 0x10 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 0x18 + lVar78)))
        ;
        auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + 0x10 + lVar78)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 0x18 + lVar78)));
        auVar118 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 0x14 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0x1c + lVar78)))
        ;
        auVar94 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 0x14 + lVar78)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0x1c + lVar78)));
        auVar119 = vunpcklps_avx(auVar95,auVar94);
        auVar125 = vunpcklps_avx(auVar136,auVar118);
        auVar94 = vunpckhps_avx(auVar136,auVar118);
        auVar118 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + 0x20 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 0x28 + lVar78)))
        ;
        auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + 0x20 + lVar78)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 0x28 + lVar78)));
        auVar128 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 0x24 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0x2c + lVar78)))
        ;
        auVar136 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 0x24 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0x2c + lVar78)))
        ;
        auVar54 = vunpcklps_avx(auVar95,auVar136);
        auVar55 = vunpcklps_avx(auVar118,auVar128);
        auVar136 = vunpckhps_avx(auVar118,auVar128);
        auVar128 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + 0x30 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 0x38 + lVar78)))
        ;
        auVar95 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar90 + 0x30 + lVar78)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar90 + 0x38 + lVar78)));
        auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 0x34 + lVar78)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0x3c + lVar78)));
        auVar118 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar90 + 0x34 + lVar78)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar90 + 0x3c + lVar78)))
        ;
        auVar57 = vunpcklps_avx(auVar95,auVar118);
        auVar58 = vunpcklps_avx(auVar128,auVar56);
        auVar95 = *(undefined1 (*) [16])(uVar90 + 0x40 + lVar78);
        local_10e0._16_16_ = auVar95;
        local_10e0._0_16_ = auVar95;
        auVar118 = vunpckhps_avx(auVar128,auVar56);
        lVar78 = uVar90 + 0x50 + lVar78;
        local_1320 = *(undefined8 *)(lVar78 + 0x10);
        uStack_1318 = *(undefined8 *)(lVar78 + 0x18);
        uStack_1310 = local_1320;
        uStack_1308 = uStack_1318;
        auVar129._16_16_ = auVar55;
        auVar129._0_16_ = auVar124;
        auVar130._16_16_ = auVar136;
        auVar130._0_16_ = auVar112;
        auVar137._16_16_ = auVar54;
        auVar137._0_16_ = auVar123;
        auVar113._16_16_ = auVar125;
        auVar113._0_16_ = auVar125;
        auVar131._16_16_ = auVar94;
        auVar131._0_16_ = auVar94;
        auVar120._16_16_ = auVar119;
        auVar120._0_16_ = auVar119;
        auVar160._16_16_ = auVar58;
        auVar160._0_16_ = auVar58;
        auVar168._16_16_ = auVar118;
        auVar168._0_16_ = auVar118;
        auVar96._16_16_ = auVar57;
        auVar96._0_16_ = auVar57;
        auVar113 = vsubps_avx(auVar129,auVar113);
        auVar103 = vsubps_avx(auVar130,auVar131);
        auVar126 = vsubps_avx(auVar137,auVar120);
        auVar98 = vsubps_avx(auVar160,auVar129);
        auVar120 = vsubps_avx(auVar168,auVar130);
        auVar96 = vsubps_avx(auVar96,auVar137);
        fVar108 = auVar103._0_4_;
        fVar167 = auVar96._0_4_;
        fVar177 = auVar103._4_4_;
        fVar169 = auVar96._4_4_;
        auVar52._4_4_ = fVar169 * fVar177;
        auVar52._0_4_ = fVar167 * fVar108;
        fVar17 = auVar103._8_4_;
        fVar170 = auVar96._8_4_;
        auVar52._8_4_ = fVar170 * fVar17;
        fVar24 = auVar103._12_4_;
        fVar171 = auVar96._12_4_;
        auVar52._12_4_ = fVar171 * fVar24;
        fVar31 = auVar103._16_4_;
        fVar172 = auVar96._16_4_;
        auVar52._16_4_ = fVar172 * fVar31;
        fVar38 = auVar103._20_4_;
        fVar173 = auVar96._20_4_;
        auVar52._20_4_ = fVar173 * fVar38;
        fVar45 = auVar103._24_4_;
        fVar174 = auVar96._24_4_;
        auVar52._24_4_ = fVar174 * fVar45;
        auVar52._28_4_ = auVar57._12_4_;
        fVar109 = auVar126._0_4_;
        fVar159 = auVar120._0_4_;
        fVar178 = auVar126._4_4_;
        fVar161 = auVar120._4_4_;
        auVar53._4_4_ = fVar161 * fVar178;
        auVar53._0_4_ = fVar159 * fVar109;
        fVar18 = auVar126._8_4_;
        fVar162 = auVar120._8_4_;
        auVar53._8_4_ = fVar162 * fVar18;
        fVar25 = auVar126._12_4_;
        fVar163 = auVar120._12_4_;
        auVar53._12_4_ = fVar163 * fVar25;
        fVar32 = auVar126._16_4_;
        fVar164 = auVar120._16_4_;
        auVar53._16_4_ = fVar164 * fVar32;
        fVar39 = auVar126._20_4_;
        fVar165 = auVar120._20_4_;
        auVar53._20_4_ = fVar165 * fVar39;
        fVar46 = auVar126._24_4_;
        uVar59 = auVar125._12_4_;
        fVar166 = auVar120._24_4_;
        auVar53._24_4_ = fVar166 * fVar46;
        auVar53._28_4_ = uVar59;
        local_13c0 = vsubps_avx(auVar53,auVar52);
        fVar145 = auVar98._0_4_;
        fVar147 = auVar98._4_4_;
        auVar60._4_4_ = fVar147 * fVar178;
        auVar60._0_4_ = fVar145 * fVar109;
        fVar148 = auVar98._8_4_;
        auVar60._8_4_ = fVar148 * fVar18;
        fVar150 = auVar98._12_4_;
        auVar60._12_4_ = fVar150 * fVar25;
        fVar152 = auVar98._16_4_;
        auVar60._16_4_ = fVar152 * fVar32;
        fVar154 = auVar98._20_4_;
        auVar60._20_4_ = fVar154 * fVar39;
        fVar156 = auVar98._24_4_;
        auVar60._24_4_ = fVar156 * fVar46;
        auVar60._28_4_ = uVar59;
        fVar110 = auVar113._0_4_;
        fVar12 = auVar113._4_4_;
        auVar62._4_4_ = fVar169 * fVar12;
        auVar62._0_4_ = fVar167 * fVar110;
        fVar19 = auVar113._8_4_;
        auVar62._8_4_ = fVar170 * fVar19;
        fVar26 = auVar113._12_4_;
        auVar62._12_4_ = fVar171 * fVar26;
        fVar33 = auVar113._16_4_;
        auVar62._16_4_ = fVar172 * fVar33;
        fVar40 = auVar113._20_4_;
        auVar62._20_4_ = fVar173 * fVar40;
        fVar47 = auVar113._24_4_;
        uVar61 = auVar119._12_4_;
        auVar62._24_4_ = fVar174 * fVar47;
        auVar62._28_4_ = uVar61;
        _local_13e0 = vsubps_avx(auVar62,auVar60);
        auVar63._4_4_ = fVar161 * fVar12;
        auVar63._0_4_ = fVar159 * fVar110;
        auVar63._8_4_ = fVar162 * fVar19;
        auVar63._12_4_ = fVar163 * fVar26;
        auVar63._16_4_ = fVar164 * fVar33;
        auVar63._20_4_ = fVar165 * fVar40;
        auVar63._24_4_ = fVar166 * fVar47;
        auVar63._28_4_ = uVar61;
        auVar64._4_4_ = fVar147 * fVar177;
        auVar64._0_4_ = fVar145 * fVar108;
        auVar64._8_4_ = fVar148 * fVar17;
        auVar64._12_4_ = fVar150 * fVar24;
        auVar64._16_4_ = fVar152 * fVar31;
        auVar64._20_4_ = fVar154 * fVar38;
        auVar64._24_4_ = fVar156 * fVar45;
        auVar64._28_4_ = auVar95._12_4_;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar179._4_4_ = uVar1;
        auVar179._0_4_ = uVar1;
        auVar179._8_4_ = uVar1;
        auVar179._12_4_ = uVar1;
        auVar179._16_4_ = uVar1;
        auVar179._20_4_ = uVar1;
        auVar179._24_4_ = uVar1;
        auVar179._28_4_ = uVar1;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar181._4_4_ = uVar2;
        auVar181._0_4_ = uVar2;
        auVar181._8_4_ = uVar2;
        auVar181._12_4_ = uVar2;
        auVar181._16_4_ = uVar2;
        auVar181._20_4_ = uVar2;
        auVar181._24_4_ = uVar2;
        auVar181._28_4_ = uVar2;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar182._4_4_ = uVar3;
        auVar182._0_4_ = uVar3;
        auVar182._8_4_ = uVar3;
        auVar182._12_4_ = uVar3;
        auVar182._16_4_ = uVar3;
        auVar182._20_4_ = uVar3;
        auVar182._24_4_ = uVar3;
        auVar182._28_4_ = uVar3;
        fVar93 = *(float *)(ray + k * 4 + 0xa0);
        local_1240 = vsubps_avx(auVar64,auVar63);
        auVar103 = vsubps_avx(auVar129,auVar179);
        fVar106 = *(float *)(ray + k * 4 + 0xc0);
        auVar126 = vsubps_avx(auVar130,auVar181);
        auVar52 = vsubps_avx(auVar137,auVar182);
        fVar135 = auVar52._0_4_;
        fVar139 = auVar52._4_4_;
        auVar65._4_4_ = fVar139 * fVar93;
        auVar65._0_4_ = fVar135 * fVar93;
        fVar140 = auVar52._8_4_;
        auVar65._8_4_ = fVar140 * fVar93;
        fVar141 = auVar52._12_4_;
        auVar65._12_4_ = fVar141 * fVar93;
        fVar142 = auVar52._16_4_;
        auVar65._16_4_ = fVar142 * fVar93;
        fVar143 = auVar52._20_4_;
        auVar65._20_4_ = fVar143 * fVar93;
        fVar144 = auVar52._24_4_;
        auVar65._24_4_ = fVar144 * fVar93;
        auVar65._28_4_ = uVar1;
        fVar111 = auVar126._0_4_;
        fVar13 = auVar126._4_4_;
        auVar66._4_4_ = fVar106 * fVar13;
        auVar66._0_4_ = fVar106 * fVar111;
        fVar20 = auVar126._8_4_;
        auVar66._8_4_ = fVar106 * fVar20;
        fVar27 = auVar126._12_4_;
        auVar66._12_4_ = fVar106 * fVar27;
        fVar34 = auVar126._16_4_;
        auVar66._16_4_ = fVar106 * fVar34;
        fVar41 = auVar126._20_4_;
        auVar66._20_4_ = fVar106 * fVar41;
        fVar48 = auVar126._24_4_;
        auVar66._24_4_ = fVar106 * fVar48;
        auVar66._28_4_ = uVar2;
        auVar126 = vsubps_avx(auVar66,auVar65);
        fVar107 = *(float *)(ray + k * 4 + 0x80);
        fVar134 = auVar103._0_4_;
        fVar14 = auVar103._4_4_;
        auVar67._4_4_ = fVar106 * fVar14;
        auVar67._0_4_ = fVar106 * fVar134;
        fVar21 = auVar103._8_4_;
        auVar67._8_4_ = fVar106 * fVar21;
        fVar28 = auVar103._12_4_;
        auVar67._12_4_ = fVar106 * fVar28;
        fVar35 = auVar103._16_4_;
        auVar67._16_4_ = fVar106 * fVar35;
        fVar42 = auVar103._20_4_;
        auVar67._20_4_ = fVar106 * fVar42;
        fVar49 = auVar103._24_4_;
        auVar67._24_4_ = fVar106 * fVar49;
        auVar67._28_4_ = uVar3;
        auVar68._4_4_ = fVar139 * fVar107;
        auVar68._0_4_ = fVar135 * fVar107;
        auVar68._8_4_ = fVar140 * fVar107;
        auVar68._12_4_ = fVar141 * fVar107;
        auVar68._16_4_ = fVar142 * fVar107;
        auVar68._20_4_ = fVar143 * fVar107;
        auVar68._24_4_ = fVar144 * fVar107;
        auVar68._28_4_ = uVar59;
        auVar52 = vsubps_avx(auVar68,auVar67);
        auVar69._4_4_ = fVar107 * fVar13;
        auVar69._0_4_ = fVar107 * fVar111;
        auVar69._8_4_ = fVar107 * fVar20;
        auVar69._12_4_ = fVar107 * fVar27;
        auVar69._16_4_ = fVar107 * fVar34;
        auVar69._20_4_ = fVar107 * fVar41;
        auVar69._24_4_ = fVar107 * fVar48;
        auVar69._28_4_ = uVar3;
        auVar70._4_4_ = fVar14 * fVar93;
        auVar70._0_4_ = fVar134 * fVar93;
        auVar70._8_4_ = fVar21 * fVar93;
        auVar70._12_4_ = fVar28 * fVar93;
        auVar70._16_4_ = fVar35 * fVar93;
        auVar70._20_4_ = fVar42 * fVar93;
        auVar70._24_4_ = fVar49 * fVar93;
        auVar70._28_4_ = uVar61;
        auVar53 = vsubps_avx(auVar70,auVar69);
        fVar175 = local_1240._0_4_;
        fVar15 = local_1240._4_4_;
        fVar22 = local_1240._8_4_;
        fVar29 = local_1240._12_4_;
        fVar36 = local_1240._16_4_;
        fVar43 = local_1240._20_4_;
        fVar50 = local_1240._24_4_;
        fVar176 = local_13c0._0_4_;
        fVar16 = local_13c0._4_4_;
        fVar23 = local_13c0._8_4_;
        fVar30 = local_13c0._12_4_;
        fVar37 = local_13c0._16_4_;
        fVar44 = local_13c0._20_4_;
        fVar51 = local_13c0._24_4_;
        auVar97._0_4_ = fVar107 * fVar176 + fVar106 * fVar175 + (float)local_13e0._0_4_ * fVar93;
        auVar97._4_4_ = fVar107 * fVar16 + fVar106 * fVar15 + (float)local_13e0._4_4_ * fVar93;
        auVar97._8_4_ = fVar107 * fVar23 + fVar106 * fVar22 + fStack_13d8 * fVar93;
        auVar97._12_4_ = fVar107 * fVar30 + fVar106 * fVar29 + fStack_13d4 * fVar93;
        auVar97._16_4_ = fVar107 * fVar37 + fVar106 * fVar36 + fStack_13d0 * fVar93;
        auVar97._20_4_ = fVar107 * fVar44 + fVar106 * fVar43 + fStack_13cc * fVar93;
        auVar97._24_4_ = fVar107 * fVar51 + fVar106 * fVar50 + fStack_13c8 * fVar93;
        auVar97._28_4_ = fVar106 + fVar106 + fVar93;
        auVar121._8_4_ = 0x80000000;
        auVar121._0_8_ = 0x8000000080000000;
        auVar121._12_4_ = 0x80000000;
        auVar121._16_4_ = 0x80000000;
        auVar121._20_4_ = 0x80000000;
        auVar121._24_4_ = 0x80000000;
        auVar121._28_4_ = 0x80000000;
        auVar103 = vandps_avx(auVar97,auVar121);
        uVar81 = auVar103._0_4_;
        auVar127._0_4_ =
             (float)(uVar81 ^ (uint)(fVar145 * auVar126._0_4_ +
                                    fVar167 * auVar53._0_4_ + fVar159 * auVar52._0_4_));
        uVar77 = auVar103._4_4_;
        auVar127._4_4_ =
             (float)(uVar77 ^ (uint)(fVar147 * auVar126._4_4_ +
                                    fVar169 * auVar53._4_4_ + fVar161 * auVar52._4_4_));
        uVar149 = auVar103._8_4_;
        auVar127._8_4_ =
             (float)(uVar149 ^
                    (uint)(fVar148 * auVar126._8_4_ +
                          fVar170 * auVar53._8_4_ + fVar162 * auVar52._8_4_));
        uVar151 = auVar103._12_4_;
        auVar127._12_4_ =
             (float)(uVar151 ^
                    (uint)(fVar150 * auVar126._12_4_ +
                          fVar171 * auVar53._12_4_ + fVar163 * auVar52._12_4_));
        uVar153 = auVar103._16_4_;
        auVar127._16_4_ =
             (float)(uVar153 ^
                    (uint)(fVar152 * auVar126._16_4_ +
                          fVar172 * auVar53._16_4_ + fVar164 * auVar52._16_4_));
        uVar155 = auVar103._20_4_;
        auVar127._20_4_ =
             (float)(uVar155 ^
                    (uint)(fVar154 * auVar126._20_4_ +
                          fVar173 * auVar53._20_4_ + fVar165 * auVar52._20_4_));
        uVar157 = auVar103._24_4_;
        auVar127._24_4_ =
             (float)(uVar157 ^
                    (uint)(fVar156 * auVar126._24_4_ +
                          fVar174 * auVar53._24_4_ + fVar166 * auVar52._24_4_));
        uVar158 = auVar103._28_4_;
        auVar127._28_4_ =
             (float)(uVar158 ^ (uint)(auVar98._28_4_ + auVar96._28_4_ + auVar120._28_4_));
        local_12e0._0_4_ =
             (float)(uVar81 ^ (uint)(auVar126._0_4_ * fVar110 +
                                    fVar109 * auVar53._0_4_ + fVar108 * auVar52._0_4_));
        local_12e0._4_4_ =
             (float)(uVar77 ^ (uint)(auVar126._4_4_ * fVar12 +
                                    fVar178 * auVar53._4_4_ + fVar177 * auVar52._4_4_));
        local_12e0._8_4_ =
             (float)(uVar149 ^
                    (uint)(auVar126._8_4_ * fVar19 + fVar18 * auVar53._8_4_ + fVar17 * auVar52._8_4_
                          ));
        local_12e0._12_4_ =
             (float)(uVar151 ^
                    (uint)(auVar126._12_4_ * fVar26 +
                          fVar25 * auVar53._12_4_ + fVar24 * auVar52._12_4_));
        local_12e0._16_4_ =
             (float)(uVar153 ^
                    (uint)(auVar126._16_4_ * fVar33 +
                          fVar32 * auVar53._16_4_ + fVar31 * auVar52._16_4_));
        local_12e0._20_4_ =
             (float)(uVar155 ^
                    (uint)(auVar126._20_4_ * fVar40 +
                          fVar39 * auVar53._20_4_ + fVar38 * auVar52._20_4_));
        local_12e0._24_4_ =
             (float)(uVar157 ^
                    (uint)(auVar126._24_4_ * fVar47 +
                          fVar46 * auVar53._24_4_ + fVar45 * auVar52._24_4_));
        local_12e0._28_4_ = (float)(uVar158 ^ (uint)(auVar53._28_4_ + auVar52._28_4_ + -0.0));
        auVar126 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar103 = vcmpps_avx(auVar127,auVar126,5);
        auVar126 = vcmpps_avx(local_12e0,auVar126,5);
        auVar103 = vandps_avx(auVar103,auVar126);
        auVar122._8_4_ = 0x7fffffff;
        auVar122._0_8_ = 0x7fffffff7fffffff;
        auVar122._12_4_ = 0x7fffffff;
        auVar122._16_4_ = 0x7fffffff;
        auVar122._20_4_ = 0x7fffffff;
        auVar122._24_4_ = 0x7fffffff;
        auVar122._28_4_ = 0x7fffffff;
        local_12a0 = vandps_avx(auVar97,auVar122);
        auVar126 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar97,4);
        auVar103 = vandps_avx(auVar103,auVar126);
        auVar98._0_4_ = auVar127._0_4_ + local_12e0._0_4_;
        auVar98._4_4_ = auVar127._4_4_ + local_12e0._4_4_;
        auVar98._8_4_ = auVar127._8_4_ + local_12e0._8_4_;
        auVar98._12_4_ = auVar127._12_4_ + local_12e0._12_4_;
        auVar98._16_4_ = auVar127._16_4_ + local_12e0._16_4_;
        auVar98._20_4_ = auVar127._20_4_ + local_12e0._20_4_;
        auVar98._24_4_ = auVar127._24_4_ + local_12e0._24_4_;
        auVar98._28_4_ = auVar127._28_4_ + local_12e0._28_4_;
        auVar126 = vcmpps_avx(auVar98,local_12a0,2);
        auVar98 = auVar126 & auVar103;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0x7f,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar98 >> 0xbf,0) != '\0') ||
            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar98[0x1f] < '\0') {
          auVar103 = vandps_avx(auVar103,auVar126);
          auVar95 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          local_12c0._0_4_ =
               (float)(uVar81 ^ (uint)(fVar176 * fVar134 +
                                      (float)local_13e0._0_4_ * fVar111 + fVar135 * fVar175));
          local_12c0._4_4_ =
               (float)(uVar77 ^ (uint)(fVar16 * fVar14 +
                                      (float)local_13e0._4_4_ * fVar13 + fVar139 * fVar15));
          local_12c0._8_4_ =
               (float)(uVar149 ^ (uint)(fVar23 * fVar21 + fStack_13d8 * fVar20 + fVar140 * fVar22));
          local_12c0._12_4_ =
               (float)(uVar151 ^ (uint)(fVar30 * fVar28 + fStack_13d4 * fVar27 + fVar141 * fVar29));
          local_12c0._16_4_ =
               (float)(uVar153 ^ (uint)(fVar37 * fVar35 + fStack_13d0 * fVar34 + fVar142 * fVar36));
          local_12c0._20_4_ =
               (float)(uVar155 ^ (uint)(fVar44 * fVar42 + fStack_13cc * fVar41 + fVar143 * fVar43));
          local_12c0._24_4_ =
               (float)(uVar157 ^ (uint)(fVar51 * fVar49 + fStack_13c8 * fVar48 + fVar144 * fVar50));
          local_12c0._28_4_ = uVar158 ^ 0x7fc00000;
          fVar93 = *(float *)(ray + k * 4 + 0x60);
          fVar106 = local_12a0._0_4_;
          fVar107 = local_12a0._4_4_;
          auVar71._4_4_ = fVar107 * fVar93;
          auVar71._0_4_ = fVar106 * fVar93;
          fVar108 = local_12a0._8_4_;
          auVar71._8_4_ = fVar108 * fVar93;
          fVar109 = local_12a0._12_4_;
          auVar71._12_4_ = fVar109 * fVar93;
          fVar110 = local_12a0._16_4_;
          auVar71._16_4_ = fVar110 * fVar93;
          fVar111 = local_12a0._20_4_;
          auVar71._20_4_ = fVar111 * fVar93;
          fVar134 = local_12a0._24_4_;
          auVar71._24_4_ = fVar134 * fVar93;
          auVar71._28_4_ = fVar93;
          auVar103 = vcmpps_avx(auVar71,local_12c0,1);
          fVar93 = *(float *)(ray + k * 4 + 0x100);
          auVar72._4_4_ = fVar107 * fVar93;
          auVar72._0_4_ = fVar106 * fVar93;
          auVar72._8_4_ = fVar108 * fVar93;
          auVar72._12_4_ = fVar109 * fVar93;
          auVar72._16_4_ = fVar110 * fVar93;
          auVar72._20_4_ = fVar111 * fVar93;
          auVar72._24_4_ = fVar134 * fVar93;
          auVar72._28_4_ = fVar93;
          auVar126 = vcmpps_avx(local_12c0,auVar72,2);
          auVar103 = vandps_avx(auVar103,auVar126);
          auVar112 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          auVar95 = vpand_avx(auVar112,auVar95);
          auVar112 = vpmovzxwd_avx(auVar95);
          auVar136 = vpslld_avx(auVar112,0x1f);
          auVar94 = vpsrad_avx(auVar136,0x1f);
          auVar112 = vpunpckhwd_avx(auVar95,auVar95);
          auVar112 = vpslld_avx(auVar112,0x1f);
          auVar112 = vpsrad_avx(auVar112,0x1f);
          local_1440._16_16_ = auVar112;
          local_1440._0_16_ = auVar94;
          if ((((((((local_1440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_1440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_1440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_1440 >> 0x7f,0) != '\0') ||
                (local_1440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar112 >> 0x3f,0) != '\0') ||
              (local_1440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar112[0xf] < '\0') {
            auStack_13f8 = auVar113._8_24_;
            local_1400 = pSVar82;
            local_1300 = auVar127;
            local_1280 = local_13c0;
            local_1260 = (float)local_13e0._0_4_;
            fStack_125c = (float)local_13e0._4_4_;
            fStack_1258 = fStack_13d8;
            fStack_1254 = fStack_13d4;
            fStack_1250 = fStack_13d0;
            fStack_124c = fStack_13cc;
            fStack_1248 = fStack_13c8;
            uStack_1244 = uStack_13c4;
            local_1220 = local_1440;
            local_1140 = local_1100;
            auVar126 = vrcpps_avx(local_12a0);
            fVar93 = auVar126._0_4_;
            auVar114._0_4_ = fVar106 * fVar93;
            fVar106 = auVar126._4_4_;
            auVar114._4_4_ = fVar107 * fVar106;
            fVar107 = auVar126._8_4_;
            auVar114._8_4_ = fVar108 * fVar107;
            fVar108 = auVar126._12_4_;
            auVar114._12_4_ = fVar109 * fVar108;
            fVar109 = auVar126._16_4_;
            auVar114._16_4_ = fVar110 * fVar109;
            fVar110 = auVar126._20_4_;
            auVar114._20_4_ = fVar111 * fVar110;
            fVar111 = auVar126._24_4_;
            auVar114._24_4_ = fVar134 * fVar111;
            auVar114._28_4_ = 0;
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = &DAT_3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar132._16_4_ = 0x3f800000;
            auVar132._20_4_ = 0x3f800000;
            auVar132._24_4_ = 0x3f800000;
            auVar132._28_4_ = 0x3f800000;
            auVar113 = vsubps_avx(auVar132,auVar114);
            fVar93 = fVar93 + fVar93 * auVar113._0_4_;
            fVar106 = fVar106 + fVar106 * auVar113._4_4_;
            fVar107 = fVar107 + fVar107 * auVar113._8_4_;
            fVar108 = fVar108 + fVar108 * auVar113._12_4_;
            fVar109 = fVar109 + fVar109 * auVar113._16_4_;
            fVar110 = fVar110 + fVar110 * auVar113._20_4_;
            fVar111 = fVar111 + fVar111 * auVar113._24_4_;
            local_11c0._4_4_ = local_12c0._4_4_ * fVar106;
            local_11c0._0_4_ = local_12c0._0_4_ * fVar93;
            local_11c0._8_4_ = local_12c0._8_4_ * fVar107;
            local_11c0._12_4_ = local_12c0._12_4_ * fVar108;
            local_11c0._16_4_ = local_12c0._16_4_ * fVar109;
            local_11c0._20_4_ = local_12c0._20_4_ * fVar110;
            local_11c0._24_4_ = local_12c0._24_4_ * fVar111;
            local_11c0._28_4_ = local_12c0._28_4_;
            auVar105 = ZEXT3264(local_11c0);
            auVar73._4_4_ = fVar106 * auVar127._4_4_;
            auVar73._0_4_ = fVar93 * auVar127._0_4_;
            auVar73._8_4_ = fVar107 * auVar127._8_4_;
            auVar73._12_4_ = fVar108 * auVar127._12_4_;
            auVar73._16_4_ = fVar109 * auVar127._16_4_;
            auVar73._20_4_ = fVar110 * auVar127._20_4_;
            auVar73._24_4_ = fVar111 * auVar127._24_4_;
            auVar73._28_4_ = auVar113._28_4_;
            auVar103 = vminps_avx(auVar73,auVar132);
            auVar74._4_4_ = fVar106 * local_12e0._4_4_;
            auVar74._0_4_ = fVar93 * local_12e0._0_4_;
            auVar74._8_4_ = fVar107 * local_12e0._8_4_;
            auVar74._12_4_ = fVar108 * local_12e0._12_4_;
            auVar74._16_4_ = fVar109 * local_12e0._16_4_;
            auVar74._20_4_ = fVar110 * local_12e0._20_4_;
            auVar74._24_4_ = fVar111 * local_12e0._24_4_;
            auVar74._28_4_ = auVar126._28_4_ + auVar113._28_4_;
            auVar126 = vminps_avx(auVar74,auVar132);
            auVar113 = vsubps_avx(auVar132,auVar103);
            auVar98 = vsubps_avx(auVar132,auVar126);
            local_11e0 = vblendvps_avx(auVar126,auVar113,local_1100);
            local_1200 = vblendvps_avx(auVar103,auVar98,local_1100);
            local_11a0[0] = fVar176 * (float)local_1120._0_4_;
            local_11a0[1] = fVar16 * (float)local_1120._4_4_;
            local_11a0[2] = fVar23 * fStack_1118;
            local_11a0[3] = fVar30 * fStack_1114;
            fStack_1190 = fVar37 * fStack_1110;
            fStack_118c = fVar44 * fStack_110c;
            fStack_1188 = fVar51 * fStack_1108;
            uStack_1184 = local_1200._28_4_;
            local_1180[0] = (float)local_13e0._0_4_ * (float)local_1120._0_4_;
            local_1180[1] = (float)local_13e0._4_4_ * (float)local_1120._4_4_;
            local_1180[2] = fStack_13d8 * fStack_1118;
            local_1180[3] = fStack_13d4 * fStack_1114;
            fStack_1170 = fStack_13d0 * fStack_1110;
            fStack_116c = fStack_13cc * fStack_110c;
            fStack_1168 = fStack_13c8 * fStack_1108;
            uStack_1164 = auVar103._28_4_;
            local_1160[0] = fVar175 * (float)local_1120._0_4_;
            local_1160[1] = fVar15 * (float)local_1120._4_4_;
            local_1160[2] = fVar22 * fStack_1118;
            local_1160[3] = fVar29 * fStack_1114;
            fStack_1150 = fVar36 * fStack_1110;
            fStack_114c = fVar43 * fStack_110c;
            fStack_1148 = fVar50 * fStack_1108;
            uStack_1144 = uStack_1104;
            auVar112 = vpunpckhwd_avx(auVar95,auVar95);
            auVar112 = vpslld_avx(auVar112,0x1f);
            auVar99._16_16_ = auVar112;
            auVar99._0_16_ = auVar136;
            auVar115._8_4_ = 0x7f800000;
            auVar115._0_8_ = 0x7f8000007f800000;
            auVar115._12_4_ = 0x7f800000;
            auVar115._16_4_ = 0x7f800000;
            auVar115._20_4_ = 0x7f800000;
            auVar115._24_4_ = 0x7f800000;
            auVar115._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar115,local_11c0,auVar99);
            auVar126 = vshufps_avx(auVar103,auVar103,0xb1);
            auVar126 = vminps_avx(auVar103,auVar126);
            auVar113 = vshufpd_avx(auVar126,auVar126,5);
            auVar126 = vminps_avx(auVar126,auVar113);
            auVar113 = vperm2f128_avx(auVar126,auVar126,1);
            auVar126 = vminps_avx(auVar126,auVar113);
            auVar103 = vcmpps_avx(auVar103,auVar126,0);
            auVar112 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
            auVar95 = vpand_avx(auVar112,auVar95);
            auVar112 = vpmovzxwd_avx(auVar95);
            auVar112 = vpslld_avx(auVar112,0x1f);
            auVar112 = vpsrad_avx(auVar112,0x1f);
            auVar95 = vpunpckhwd_avx(auVar95,auVar95);
            auVar95 = vpslld_avx(auVar95,0x1f);
            auVar95 = vpsrad_avx(auVar95,0x1f);
            auVar100._16_16_ = auVar95;
            auVar100._0_16_ = auVar112;
            if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar100 >> 0x7f,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar95 >> 0x3f,0) == '\0') &&
                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar95[0xf]) {
              auVar100 = local_1440;
            }
            uVar77 = vmovmskps_avx(auVar100);
            uVar81 = 0;
            if (uVar77 != 0) {
              for (; (uVar77 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
              }
            }
LAB_003dc276:
            uVar89 = (ulong)uVar81;
            uVar81 = *(uint *)(local_10e0 + uVar89 * 4);
            pGVar10 = (pSVar82->geometries).items[uVar81].ptr;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_1440 + uVar89 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar1 = *(undefined4 *)(local_1200 + uVar89 * 4);
                uVar2 = *(undefined4 *)(local_11e0 + uVar89 * 4);
                *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar89 - 8];
                *(float *)(ray + k * 4 + 0x180) = local_11a0[uVar89];
                *(float *)(ray + k * 4 + 0x1a0) = local_1180[uVar89];
                *(float *)(ray + k * 4 + 0x1c0) = local_1160[uVar89];
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar1;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&local_1320 + uVar89 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar81;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                goto LAB_003dc046;
              }
              local_1420 = auVar105._0_32_;
              local_13e0 = auVar86;
              local_13c0._0_8_ = uVar87;
              uVar1 = *(undefined4 *)(local_1200 + uVar89 * 4);
              local_1060._4_4_ = uVar1;
              local_1060._0_4_ = uVar1;
              local_1060._8_4_ = uVar1;
              local_1060._12_4_ = uVar1;
              local_1060._16_4_ = uVar1;
              local_1060._20_4_ = uVar1;
              local_1060._24_4_ = uVar1;
              local_1060._28_4_ = uVar1;
              local_1040 = *(undefined4 *)(local_11e0 + uVar89 * 4);
              uVar1 = *(undefined4 *)((long)&local_1320 + uVar89 * 4);
              local_1020._4_4_ = uVar1;
              local_1020._0_4_ = uVar1;
              local_1020._8_4_ = uVar1;
              local_1020._12_4_ = uVar1;
              local_1020._16_4_ = uVar1;
              local_1020._20_4_ = uVar1;
              local_1020._24_4_ = uVar1;
              local_1020._28_4_ = uVar1;
              fVar93 = local_11a0[uVar89];
              fVar106 = local_1180[uVar89];
              local_10a0._4_4_ = fVar106;
              local_10a0._0_4_ = fVar106;
              local_10a0._8_4_ = fVar106;
              local_10a0._12_4_ = fVar106;
              local_10a0._16_4_ = fVar106;
              local_10a0._20_4_ = fVar106;
              local_10a0._24_4_ = fVar106;
              local_10a0._28_4_ = fVar106;
              auStack_ff0 = vpshufd_avx(ZEXT416(uVar81),0);
              auVar103 = ZEXT1632(auStack_ff0);
              fVar106 = local_1160[uVar89];
              local_1080._4_4_ = fVar106;
              local_1080._0_4_ = fVar106;
              local_1080._8_4_ = fVar106;
              local_1080._12_4_ = fVar106;
              local_1080._16_4_ = fVar106;
              local_1080._20_4_ = fVar106;
              local_1080._24_4_ = fVar106;
              local_1080._28_4_ = fVar106;
              local_10c0[0] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[1] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[2] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[3] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              local_10c0[4] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[5] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[6] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[7] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              local_10c0[8] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[9] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[10] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[0xb] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              local_10c0[0xc] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[0xd] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[0xe] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[0xf] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              local_10c0[0x10] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[0x11] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              local_10c0[0x14] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[0x15] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              local_10c0[0x18] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[0x19] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              local_10c0[0x1c] = (RTCHitN)SUB41(fVar93,0);
              local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar93 >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar93 >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar93 >> 0x18);
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              local_1000 = auStack_ff0;
              vcmpps_avx(local_1060,local_1060,0xf);
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar89 - 8];
              local_14a0 = *(undefined8 *)(mm_lookupmask_ps + uVar79);
              uStack_1498 = *(undefined8 *)(mm_lookupmask_ps + uVar79 + 8);
              local_1490 = *(undefined8 *)(mm_lookupmask_ps + lVar80);
              uStack_1488 = *(undefined8 *)(mm_lookupmask_ps + lVar80 + 8);
              local_1470.valid = (int *)&local_14a0;
              local_1470.geometryUserPtr = pGVar10->userPtr;
              local_1470.context = context->user;
              local_1470.hit = local_10c0;
              local_1470.N = 8;
              local_1470.ray = (RTCRayN *)ray;
              if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar103 = ZEXT1632(auStack_ff0);
                (*pGVar10->intersectionFilterN)(&local_1470);
              }
              auVar54._8_8_ = uStack_1498;
              auVar54._0_8_ = local_14a0;
              auVar95 = vpcmpeqd_avx((undefined1  [16])0x0,auVar54);
              auVar55._8_8_ = uStack_1488;
              auVar55._0_8_ = local_1490;
              auVar112 = vpcmpeqd_avx((undefined1  [16])0x0,auVar55);
              auVar101._16_16_ = auVar112;
              auVar101._0_16_ = auVar95;
              auVar126 = _DAT_0205a980 & ~auVar101;
              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar126 >> 0x7f,0) == '\0') &&
                    (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0xbf,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar126[0x1f]) {
                auVar105 = ZEXT3264(CONCAT428(auVar112._12_4_ ^ 0xffffffff,
                                              CONCAT424(auVar112._8_4_ ^ 0xffffffff,
                                                        CONCAT420(auVar112._4_4_ ^ 0xffffffff,
                                                                  CONCAT416(auVar112._0_4_ ^
                                                                            0xffffffff,
                                                                            CONCAT412(auVar95._12_4_
                                                                                      ^ 0xffffffff,
                                                                                      CONCAT48(
                                                  auVar95._8_4_ ^ 0xffffffff,
                                                  auVar95._0_8_ ^ 0xffffffffffffffff)))))));
              }
              else {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar103 = ZEXT1632(auVar103._0_16_);
                  (*p_Var11)(&local_1470);
                }
                auVar56._8_8_ = uStack_1498;
                auVar56._0_8_ = local_14a0;
                auVar95 = vpcmpeqd_avx((undefined1  [16])0x0,auVar56);
                auVar57._8_8_ = uStack_1488;
                auVar57._0_8_ = local_1490;
                auVar112 = vpcmpeqd_avx((undefined1  [16])0x0,auVar57);
                auVar117._16_16_ = auVar112;
                auVar117._0_16_ = auVar95;
                auVar103 = vcmpps_avx(auVar103,auVar103,0xf);
                auVar102._0_4_ = auVar95._0_4_ ^ auVar103._0_4_;
                auVar102._4_4_ = auVar95._4_4_ ^ auVar103._4_4_;
                auVar102._8_4_ = auVar95._8_4_ ^ auVar103._8_4_;
                auVar102._12_4_ = auVar95._12_4_ ^ auVar103._12_4_;
                auVar102._16_4_ = auVar112._0_4_ ^ auVar103._16_4_;
                auVar102._20_4_ = auVar112._4_4_ ^ auVar103._20_4_;
                auVar102._24_4_ = auVar112._8_4_ ^ auVar103._24_4_;
                auVar102._28_4_ = auVar112._12_4_ ^ auVar103._28_4_;
                auVar105 = ZEXT3264(auVar102);
                auVar103 = auVar103 & ~auVar117;
                if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar103 >> 0x7f,0) != '\0') ||
                      (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar103 >> 0xbf,0) != '\0') ||
                    (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar103[0x1f] < '\0') {
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])local_1470.hit);
                  *(undefined1 (*) [32])(local_1470.ray + 0x180) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0x20));
                  *(undefined1 (*) [32])(local_1470.ray + 0x1a0) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0x40));
                  *(undefined1 (*) [32])(local_1470.ray + 0x1c0) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0x60));
                  *(undefined1 (*) [32])(local_1470.ray + 0x1e0) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0x80));
                  *(undefined1 (*) [32])(local_1470.ray + 0x200) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0xa0));
                  *(undefined1 (*) [32])(local_1470.ray + 0x220) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0xc0));
                  *(undefined1 (*) [32])(local_1470.ray + 0x240) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0xe0));
                  *(undefined1 (*) [32])(local_1470.ray + 0x260) = auVar103;
                  auVar103 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_1470.hit + 0x100))
                  ;
                  *(undefined1 (*) [32])(local_1470.ray + 0x280) = auVar103;
                }
              }
              auVar103 = auVar105._0_32_;
              if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar103 >> 0x7f,0) == '\0') &&
                    (auVar105 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                   SUB321(auVar103 >> 0xbf,0) == '\0') &&
                  (auVar105 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                  -1 < auVar105[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
              }
              *(undefined4 *)(local_1440 + uVar89 * 4) = 0;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar104._4_4_ = uVar1;
              auVar104._0_4_ = uVar1;
              auVar104._8_4_ = uVar1;
              auVar104._12_4_ = uVar1;
              auVar104._16_4_ = uVar1;
              auVar104._20_4_ = uVar1;
              auVar104._24_4_ = uVar1;
              auVar104._28_4_ = uVar1;
              auVar105 = ZEXT3264(local_1420);
              auVar103 = vcmpps_avx(local_1420,auVar104,2);
              local_1440 = vandps_avx(auVar103,local_1440);
              pSVar82 = local_1400;
              auVar86 = local_13e0;
              uVar87 = local_13c0._0_8_;
            }
            if ((((((((local_1440 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1440 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1440 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1440 >> 0x7f,0) == '\0') &&
                  (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1440 >> 0xbf,0) == '\0') &&
                (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1440[0x1f]) goto LAB_003dc046;
            auVar116._8_4_ = 0x7f800000;
            auVar116._0_8_ = 0x7f8000007f800000;
            auVar116._12_4_ = 0x7f800000;
            auVar116._16_4_ = 0x7f800000;
            auVar116._20_4_ = 0x7f800000;
            auVar116._24_4_ = 0x7f800000;
            auVar116._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar116,auVar105._0_32_,local_1440);
            auVar126 = vshufps_avx(auVar103,auVar103,0xb1);
            auVar126 = vminps_avx(auVar103,auVar126);
            auVar113 = vshufpd_avx(auVar126,auVar126,5);
            auVar126 = vminps_avx(auVar126,auVar113);
            auVar113 = vperm2f128_avx(auVar126,auVar126,1);
            auVar126 = vminps_avx(auVar126,auVar113);
            auVar126 = vcmpps_avx(auVar103,auVar126,0);
            auVar113 = local_1440 & auVar126;
            auVar103 = local_1440;
            if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar113 >> 0x7f,0) != '\0') ||
                  (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0xbf,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar113[0x1f] < '\0') {
              auVar103 = vandps_avx(auVar126,local_1440);
            }
            uVar77 = vmovmskps_avx(auVar103);
            uVar81 = 0;
            if (uVar77 != 0) {
              for (; (uVar77 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
              }
            }
            goto LAB_003dc276;
          }
        }
LAB_003dc046:
        lVar92 = lVar92 + 1;
      } while ((undefined1  [8])lVar92 != auVar86);
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar105 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
    auVar133 = ZEXT1664(local_1330);
    auVar138 = ZEXT1664(local_1340);
    auVar146 = ZEXT1664(local_1350);
    auVar180 = ZEXT1664(local_1390);
    fVar93 = local_1360;
    fVar106 = fStack_135c;
    fVar107 = fStack_1358;
    fVar108 = fStack_1354;
    fVar109 = local_1370;
    fVar110 = fStack_136c;
    fVar111 = fStack_1368;
    fVar134 = fStack_1364;
    fVar175 = local_1380;
    fVar176 = fStack_137c;
    fVar177 = fStack_1378;
    fVar178 = fStack_1374;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }